

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void pnga_add_diagonal(Integer g_a,Integer g_v)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  Integer IVar4;
  Integer icode;
  Integer IVar5;
  Integer IVar6;
  int iVar7;
  Integer IVar8;
  double *buf;
  int *piVar9;
  float *pfVar10;
  undefined1 (*pauVar11) [16];
  long *plVar12;
  double *pdVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  Integer IVar17;
  bool bVar18;
  char *ptr;
  Integer ld;
  Integer atype;
  Integer vtype;
  Integer vdims;
  Integer vndim;
  Integer local_388;
  Integer vlo;
  Integer hiA [2];
  Integer loA [2];
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar3 = _ga_sync_end;
  bVar18 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar18) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_add_diagonal_");
  pnga_check_handle(g_v,"ga_add_diagonal_");
  pnga_inquire(g_a,&atype,&andim,adims);
  icode = atype;
  pnga_inquire(g_v,&vtype,&vndim,&vdims);
  if (andim != 2) {
    pnga_error("ga_add_diagonal: wrong dimension for g_a.",andim);
  }
  if (vndim != 1) {
    pnga_error("ga_add_diagonal: wrong dimension for g_v.",vndim);
  }
  if (adims[0] < adims[1]) {
    adims[1] = adims[0];
  }
  if (vdims != adims[1]) {
    pnga_error("ga_add_diagonal: The size of the first array\'s diagonal is greater than the size of the second array."
               ,icode);
  }
  if (vtype != atype) {
    pnga_error("ga_add_diagonal: input global arrays do not have the same data type. Global array type ="
               ,atype);
  }
  pnga_local_iterator_init(g_a,&hdl);
  while (iVar7 = pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld), IVar6 = loA[1], IVar5 = loA[0],
        IVar4 = ld, pcVar14 = ptr, iVar7 != 0) {
    if (0 < loA[0]) {
      IVar17 = loA[1];
      if (loA[1] < loA[0]) {
        IVar17 = loA[0];
      }
      IVar8 = hiA[1];
      if (hiA[0] < hiA[1]) {
        IVar8 = hiA[0];
      }
      lVar16 = IVar8 - IVar17;
      if (IVar17 <= IVar8) {
        IVar8 = GAsizeof(icode);
        buf = (double *)malloc((lVar16 + 1) * IVar8);
        if (buf == (double *)0x0) {
          pnga_error("ga_add_diagonal_:failed to allocate memory for the local buffer.",0);
        }
        pnga_get(g_v,&vlo,&local_388,buf,&local_388);
        switch(icode) {
        case 0x3e9:
          piVar9 = (int *)(pcVar14 + (IVar17 - IVar6) * IVar4 * 4 + (IVar17 - IVar5) * 4);
          for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
            *piVar9 = *piVar9 + *(int *)((long)buf + lVar15 * 4);
            piVar9 = piVar9 + IVar4 + 1;
          }
          break;
        case 0x3ea:
          plVar12 = (long *)(pcVar14 + (IVar17 - IVar6) * IVar4 * 8 + (IVar17 - IVar5) * 8);
          for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
            *plVar12 = *plVar12 + (long)buf[lVar15];
            plVar12 = plVar12 + IVar4 + 1;
          }
          break;
        case 0x3eb:
          pfVar10 = (float *)(pcVar14 + (IVar17 - IVar6) * IVar4 * 4 + (IVar17 - IVar5) * 4);
          for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
            *pfVar10 = *(float *)((long)buf + lVar15 * 4) + *pfVar10;
            pfVar10 = pfVar10 + IVar4 + 1;
          }
          break;
        case 0x3ec:
          pdVar13 = (double *)(pcVar14 + (IVar17 - IVar6) * IVar4 * 8 + (IVar17 - IVar5) * 8);
          for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
            *pdVar13 = buf[lVar15] + *pdVar13;
            pdVar13 = pdVar13 + IVar4 + 1;
          }
          break;
        default:
          pnga_error("ga_add_diagonal_: wrong data type:",icode);
          break;
        case 0x3ee:
          pcVar14 = pcVar14 + (IVar17 - IVar6) * IVar4 * 8 + (IVar17 - IVar5) * 8;
          for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
            *(ulong *)pcVar14 =
                 CONCAT44((float)((ulong)*(undefined8 *)pcVar14 >> 0x20) +
                          (float)((ulong)buf[lVar15] >> 0x20),
                          (float)*(undefined8 *)pcVar14 + SUB84(buf[lVar15],0));
            pcVar14 = pcVar14 + IVar4 * 8 + 8;
          }
          break;
        case 0x3ef:
          pauVar11 = (undefined1 (*) [16])
                     (pcVar14 + (IVar17 - IVar6) * IVar4 * 0x10 + (IVar17 - IVar5) * 0x10);
          pdVar13 = buf;
          for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
            dVar2 = *(double *)(*pauVar11 + 8) + pdVar13[1];
            auVar1._8_4_ = SUB84(dVar2,0);
            auVar1._0_8_ = *(double *)*pauVar11 + *pdVar13;
            auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
            *pauVar11 = auVar1;
            pdVar13 = pdVar13 + 2;
            pauVar11 = pauVar11 + IVar4 + 1;
          }
        }
        free(buf);
      }
    }
  }
  if (iVar3 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_add_diagonal(Integer g_a, Integer g_v)
{
  Integer vndim, vdims, dim1, dim2, vtype, atype, type;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  Integer andim, adims[2];
  Integer loA[2], hiA[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  char *ptr;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_add_diagonal_");
  pnga_check_handle (g_v, "ga_add_diagonal_");

  pnga_inquire(g_a, &atype, &andim, adims);
  dim1 = adims[0];
  dim2 = adims[1];
  type = atype;
  pnga_inquire(g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_add_diagonal: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_add_diagonal: wrong dimension for g_v.", vndim);


  if (vdims != GA_MIN (dim1, dim2))
    pnga_error
      ("ga_add_diagonal: The size of the first array's diagonal is greater than the size of the second array.",
       type);

  if (vtype != atype)
  {
    pnga_error
      ("ga_add_diagonal: input global arrays do not have the same data type. Global array type =",
       atype);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_add_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_add_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_add_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_add_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}